

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnderwaterAcousticEmitterBeam.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam::Encode
          (UnderwaterAcousticEmitterBeam *this,KDataStream *stream)

{
  KDataStream *pKVar1;
  KDataStream *stream_local;
  UnderwaterAcousticEmitterBeam *this_local;
  
  pKVar1 = KDataStream::operator<<(stream,this->m_ui8BeamDataLength);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui8BeamIDNumber);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui16Padding1);
  DATA_TYPE::operator<<(pKVar1,&(this->m_UAFPD).super_DataTypeBase);
  return;
}

Assistant:

void UnderwaterAcousticEmitterBeam::Encode( KDataStream & stream ) const
{
    stream << m_ui8BeamDataLength
           << m_ui8BeamIDNumber
           << m_ui16Padding1
           << KDIS_STREAM m_UAFPD;
}